

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O3

bool absl::lts_20250127::debugging_internal::ParseNumber(State *state,int *number_out)

{
  bool bVar1;
  bool bVar2;
  byte *pbVar3;
  int iVar4;
  int iVar5;
  byte bVar6;
  
  iVar4 = state->recursion_depth;
  iVar5 = state->steps;
  state->recursion_depth = iVar4 + 1;
  state->steps = iVar5 + 1;
  if (iVar5 < 0x20000 && iVar4 < 0x100) {
    bVar2 = ParseOneCharToken(state,'n');
    iVar4 = (state->parse_state).mangled_idx;
    bVar6 = state->mangled_begin[iVar4];
    iVar5 = 0;
    bVar1 = false;
    if ((byte)(bVar6 - 0x30) < 10) {
      pbVar3 = (byte *)(state->mangled_begin + iVar4);
      do {
        pbVar3 = pbVar3 + 1;
        iVar5 = (uint)bVar6 + iVar5 * 10 + -0x30;
        bVar6 = *pbVar3;
        iVar4 = iVar4 + 1;
      } while ((byte)(bVar6 - 0x30) < 10);
      (state->parse_state).mangled_idx = iVar4;
      bVar1 = true;
      if (number_out != (int *)0x0) {
        iVar4 = -iVar5;
        if (!bVar2) {
          iVar4 = iVar5;
        }
        *number_out = iVar4;
      }
    }
  }
  else {
    bVar1 = false;
  }
  state->recursion_depth = state->recursion_depth + -1;
  return bVar1;
}

Assistant:

static bool ParseNumber(State *state, int *number_out) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  bool negative = false;
  if (ParseOneCharToken(state, 'n')) {
    negative = true;
  }
  const char *p = RemainingInput(state);
  uint64_t number = 0;
  for (; *p != '\0'; ++p) {
    if (IsDigit(*p)) {
      number = number * 10 + static_cast<uint64_t>(*p - '0');
    } else {
      break;
    }
  }
  // Apply the sign with uint64_t arithmetic so overflows aren't UB.  Gives
  // "incorrect" results for out-of-range inputs, but negative values only
  // appear for literals, which aren't printed.
  if (negative) {
    number = ~number + 1;
  }
  if (p != RemainingInput(state)) {  // Conversion succeeded.
    state->parse_state.mangled_idx += p - RemainingInput(state);
    UpdateHighWaterMark(state);
    if (number_out != nullptr) {
      // Note: possibly truncate "number".
      *number_out = static_cast<int>(number);
    }
    return true;
  }
  return false;
}